

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_BucketCount_Test<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_BucketCount_Test<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  pointer pcVar1;
  pointer pbVar2;
  int index;
  char *pcVar3;
  AssertionResult gtest_ar;
  TypeParam ht;
  key_equal local_130;
  string local_120;
  pair<google::dense_hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_100;
  HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  local_e0;
  
  local_120._M_dataplus._M_p = (pointer)0x0;
  local_120._M_string_length._0_4_ = 0;
  local_130.id_ = 0;
  local_130.num_hashes_ = 0;
  local_130.num_compares_ = 0;
  local_100.first.ht._0_4_ = 0;
  local_100.first.pos = (pointer)0x0;
  google::
  HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (&local_e0,100,(hasher *)&local_120,&local_130,(allocator_type *)&local_100);
  local_120._M_dataplus._M_p =
       (pointer)local_e0.
                super_BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.rep.num_buckets;
  local_130.id_ = 100;
  testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
            ((internal *)&local_100,"ht.bucket_count()","100u",(unsigned_long *)&local_120,
             (uint *)&local_130);
  if ((char)local_100.first.ht == '\0') {
    testing::Message::Message((Message *)&local_120);
    if (local_100.first.pos == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_100.first.pos)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x24a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
    if ((long *)local_120._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_120._M_dataplus._M_p + 8))();
    }
  }
  pbVar2 = local_100.first.pos;
  if (local_100.first.pos != (pointer)0x0) {
    pcVar1 = ((local_100.first.pos)->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(local_100.first.pos)->field_2) {
      operator_delete(pcVar1);
    }
    operator_delete(pbVar2);
  }
  this_00 = &local_e0.
             super_BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  index = 1;
  do {
    UniqueObjectHelper<std::__cxx11::string>(&local_120,index);
    google::
    dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(&this_00->rep,1);
    google::
    dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
    ::insert_noresize<std::__cxx11::string_const&,std::__cxx11::string_const&>
              (&local_100,
               (dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
                *)this_00,&local_120,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    index = index + 1;
  } while (index != 200);
  local_120._M_dataplus._M_p =
       (pointer)local_e0.
                super_BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.rep.num_buckets;
  local_130.id_ = 200;
  testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
            ((internal *)&local_100,"ht.bucket_count()","200u",(unsigned_long *)&local_120,
             (uint *)&local_130);
  if ((char)local_100.first.ht == '\0') {
    testing::Message::Message((Message *)&local_120);
    if (local_100.first.pos == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_100.first.pos)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x24e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
    if ((long *)local_120._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_120._M_dataplus._M_p + 8))();
    }
  }
  pbVar2 = local_100.first.pos;
  if (local_100.first.pos != (pointer)0x0) {
    pcVar1 = ((local_100.first.pos)->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(local_100.first.pos)->field_2) {
      operator_delete(pcVar1);
    }
    operator_delete(pbVar2);
  }
  local_e0.
  super_BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c25898;
  google::
  dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~dense_hashtable(&local_e0.
                      super_BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                      .ht_.rep);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, BucketCount) {
  TypeParam ht(100);
  // constructor arg is number of *items* to be inserted, not the
  // number of buckets, so we expect more buckets.
  EXPECT_GT(ht.bucket_count(), 100u);
  for (int i = 1; i < 200; i++) {
    ht.insert(this->UniqueObject(i));
  }
  EXPECT_GT(ht.bucket_count(), 200u);
}